

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O1

void dtl_json_writer_increaseIndent(dtl_json_writer_t *self)

{
  int iVar1;
  adt_error_t aVar2;
  uint32_t uVar3;
  uint8_t *__s;
  uint8_t *puVar4;
  int iVar5;
  
  if (0 < self->indentWidth) {
    iVar1 = self->currentIndent;
    uVar3 = adt_bytearray_length(self->indentArray);
    iVar5 = self->currentIndent + self->indentWidth;
    self->currentIndent = iVar5;
    if ((int)uVar3 < iVar5) {
      aVar2 = adt_bytearray_resize(self->indentArray,iVar5 + 1);
      if (aVar2 != '\0') {
        return;
      }
      __s = adt_bytearray_data(self->indentArray);
      if (__s == (uint8_t *)0x0) {
        __assert_fail("data != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                      ,0xf2,"void dtl_json_writer_growIndentArray(dtl_json_writer_t *)");
      }
      iVar1 = self->currentIndent;
      puVar4 = __s;
    }
    else {
      puVar4 = adt_bytearray_data(self->indentArray);
      __s = puVar4 + iVar1;
      iVar1 = self->indentWidth;
    }
    memset(__s,0x20,(long)iVar1);
    puVar4[self->currentIndent] = '\0';
  }
  return;
}

Assistant:

static void dtl_json_writer_increaseIndent(dtl_json_writer_t *self)
{
   if (self->indentWidth > 0)
   {
      int32_t oldIndent = self->currentIndent;
      int32_t currentLen = adt_bytearray_length(self->indentArray);
      self->currentIndent+=self->indentWidth;
      if (currentLen < self->currentIndent)
      {
         dtl_json_writer_growIndentArray(self);
      }
      else
      {
         uint8_t *data = adt_bytearray_data(self->indentArray);
         memset(&data[oldIndent], m_indentChar, self->indentWidth);
         data[self->currentIndent] = 0u;
      }
   }
}